

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAp_kry.c
# Opt level: O3

void GSIter(sunrealtype gamma,N_Vector z,N_Vector x,WebData wdata)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  char cVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  char cVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  double dVar20;
  double dVar21;
  sunrealtype gam2 [6];
  sunrealtype gam [6];
  sunrealtype beta2 [6];
  sunrealtype beta [6];
  sunrealtype cof1 [6];
  ulong local_180;
  double adStack_128 [6];
  double adStack_f8 [6];
  double adStack_c8 [6];
  double adStack_98 [6];
  double adStack_68 [7];
  
  lVar4 = N_VGetArrayPointer(x);
  lVar5 = N_VGetArrayPointer(z);
  uVar19 = wdata->ns;
  lVar8 = (long)(int)uVar19;
  uVar11 = (ulong)uVar19;
  uVar2 = wdata->mx;
  uVar3 = wdata->my;
  uVar10 = (ulong)uVar3;
  if (0 < lVar8) {
    lVar9 = 0;
    do {
      dVar20 = *(double *)((long)wdata->cox + lVar9);
      dVar1 = *(double *)((long)wdata->coy + lVar9);
      dVar21 = 1.0 / ((dVar20 + dVar1) * (gamma + gamma) + 1.0);
      dVar20 = dVar20 * gamma * dVar21;
      *(double *)((long)adStack_98 + lVar9) = dVar20;
      *(double *)((long)adStack_c8 + lVar9) = dVar20 + dVar20;
      dVar20 = dVar1 * gamma * dVar21;
      *(double *)((long)adStack_f8 + lVar9) = dVar20;
      *(double *)((long)adStack_128 + lVar9) = dVar20 + dVar20;
      *(double *)((long)adStack_68 + lVar9) = dVar21;
      lVar9 = lVar9 + 8;
    } while (uVar11 * 8 - lVar9 != 0);
  }
  lVar9 = (long)wdata->mxns;
  if (0 < (int)uVar3) {
    uVar12 = 0;
    lVar13 = lVar4;
    do {
      if (0 < (int)uVar2) {
        uVar17 = 0;
        lVar15 = lVar5;
        lVar16 = lVar13;
        do {
          if (0 < (int)uVar19) {
            uVar18 = 0;
            do {
              *(double *)(lVar16 + uVar18 * 8) =
                   adStack_68[uVar18] * *(double *)(lVar15 + uVar18 * 8);
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          lVar16 = lVar16 + lVar8 * 8;
          lVar15 = lVar15 + lVar8 * 8;
        } while (uVar17 != uVar2);
      }
      uVar12 = uVar12 + 1;
      lVar13 = lVar13 + lVar9 * 8;
      lVar5 = lVar5 + lVar9 * 8;
    } while (uVar12 != uVar10);
  }
  N_VConst(0,z);
  lVar13 = lVar8 * -8;
  lVar5 = lVar9 * -8;
  uVar6 = 1;
  do {
    if (1 < uVar6 && 0 < (int)uVar3) {
      local_180 = 0;
      do {
        if (0 < (int)uVar2) {
          uVar19 = (uint)(local_180 == uVar3 - 1) * 3 + 3;
          if (local_180 == 0) {
            uVar19 = 0;
          }
          (*(code *)((long)&DAT_00105100 + (long)(int)(&DAT_00105100)[uVar19]))();
          return;
        }
        local_180 = local_180 + 1;
      } while (local_180 != uVar10);
    }
    if (0 < (int)uVar3) {
      uVar12 = 0;
      lVar15 = lVar4;
      do {
        if (0 < (int)uVar2) {
          cVar7 = (uVar12 == uVar3 - 1) * '\x03' + '\x03';
          if (uVar12 == 0) {
            cVar7 = '\0';
          }
          uVar17 = 0;
          lVar16 = lVar15;
          do {
            cVar14 = (uVar17 == uVar2 - 1) + '\x01';
            if (uVar17 == 0) {
              cVar14 = '\0';
            }
            switch(cVar14 + cVar7) {
            case '\x01':
              if (0 < (int)uVar19) {
                uVar18 = 0;
                do {
                  *(double *)(lVar16 + uVar18 * 8) =
                       adStack_98[uVar18] * *(double *)(lVar16 + lVar13 + uVar18 * 8) +
                       *(double *)(lVar16 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar11 != uVar18);
              }
              break;
            case '\x02':
              if (0 < (int)uVar19) {
                uVar18 = 0;
                do {
                  *(double *)(lVar16 + uVar18 * 8) =
                       adStack_c8[uVar18] * *(double *)(lVar16 + lVar13 + uVar18 * 8) +
                       *(double *)(lVar16 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar11 != uVar18);
              }
              break;
            case '\x03':
              if (0 < (int)uVar19) {
                uVar18 = 0;
                do {
                  *(double *)(lVar16 + uVar18 * 8) =
                       adStack_f8[uVar18] * *(double *)(lVar5 + lVar16 + uVar18 * 8) +
                       *(double *)(lVar16 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar11 != uVar18);
              }
              break;
            case '\x04':
              if (0 < (int)uVar19) {
                uVar18 = 0;
                do {
                  *(double *)(lVar16 + uVar18 * 8) =
                       adStack_98[uVar18] * *(double *)(lVar16 + lVar13 + uVar18 * 8) +
                       *(double *)(lVar16 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar11 != uVar18);
                uVar18 = 0;
                do {
                  *(double *)(lVar16 + uVar18 * 8) =
                       adStack_f8[uVar18] * *(double *)(lVar5 + lVar16 + uVar18 * 8) +
                       *(double *)(lVar16 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar11 != uVar18);
              }
              break;
            case '\x05':
              if (0 < (int)uVar19) {
                uVar18 = 0;
                do {
                  *(double *)(lVar16 + uVar18 * 8) =
                       adStack_c8[uVar18] * *(double *)(lVar16 + lVar13 + uVar18 * 8) +
                       *(double *)(lVar16 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar11 != uVar18);
                uVar18 = 0;
                do {
                  *(double *)(lVar16 + uVar18 * 8) =
                       adStack_f8[uVar18] * *(double *)(lVar5 + lVar16 + uVar18 * 8) +
                       *(double *)(lVar16 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar11 != uVar18);
              }
              break;
            case '\x06':
              if (0 < (int)uVar19) {
                uVar18 = 0;
                do {
                  *(double *)(lVar16 + uVar18 * 8) =
                       adStack_128[uVar18] * *(double *)(lVar5 + lVar16 + uVar18 * 8) +
                       *(double *)(lVar16 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar11 != uVar18);
              }
              break;
            case '\a':
              if (0 < (int)uVar19) {
                uVar18 = 0;
                do {
                  *(double *)(lVar16 + uVar18 * 8) =
                       adStack_98[uVar18] * *(double *)(lVar16 + lVar13 + uVar18 * 8) +
                       *(double *)(lVar16 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar11 != uVar18);
                uVar18 = 0;
                do {
                  *(double *)(lVar16 + uVar18 * 8) =
                       adStack_128[uVar18] * *(double *)(lVar5 + lVar16 + uVar18 * 8) +
                       *(double *)(lVar16 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar11 != uVar18);
              }
              break;
            case '\b':
              if (0 < (int)uVar19) {
                uVar18 = 0;
                do {
                  *(double *)(lVar16 + uVar18 * 8) =
                       adStack_c8[uVar18] * *(double *)(lVar16 + lVar13 + uVar18 * 8) +
                       *(double *)(lVar16 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar11 != uVar18);
                uVar18 = 0;
                do {
                  *(double *)(lVar16 + uVar18 * 8) =
                       adStack_128[uVar18] * *(double *)(lVar5 + lVar16 + uVar18 * 8) +
                       *(double *)(lVar16 + uVar18 * 8);
                  uVar18 = uVar18 + 1;
                } while (uVar11 != uVar18);
              }
            }
            uVar17 = uVar17 + 1;
            lVar16 = lVar16 + lVar8 * 8;
          } while (uVar17 != uVar2);
        }
        uVar12 = uVar12 + 1;
        lVar15 = lVar15 + lVar9 * 8;
      } while (uVar12 != uVar10);
    }
    N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,z,x,z);
    uVar6 = uVar6 + 1;
  } while (uVar6 != 6);
  return;
}

Assistant:

static void GSIter(sunrealtype gamma, N_Vector z, N_Vector x, WebData wdata)
{
  int i, ic, iter, iyoff, jx, jy, ns, mxns, mx, my, x_loc, y_loc;
  sunrealtype beta[NS], beta2[NS], cof1[NS], gam[NS], gam2[NS];
  sunrealtype temp, *cox, *coy, *xd, *zd;

  xd   = N_VGetArrayPointer(x);
  zd   = N_VGetArrayPointer(z);
  ns   = wdata->ns;
  mx   = wdata->mx;
  my   = wdata->my;
  mxns = wdata->mxns;
  cox  = wdata->cox;
  coy  = wdata->coy;

  /* Write matrix as P = D - L - U.
     Load local arrays beta, beta2, gam, gam2, and cof1. */

  for (i = 0; i < ns; i++)
  {
    temp     = ONE / (ONE + TWO * gamma * (cox[i] + coy[i]));
    beta[i]  = gamma * cox[i] * temp;
    beta2[i] = TWO * beta[i];
    gam[i]   = gamma * coy[i] * temp;
    gam2[i]  = TWO * gam[i];
    cof1[i]  = temp;
  }

  /* Begin iteration loop.
  Load vector x with (D-inverse)*z for first iteration. */

  for (jy = 0; jy < my; jy++)
  {
    iyoff = mxns * jy;
    for (jx = 0; jx < mx; jx++)
    {
      ic = iyoff + ns * jx;
      v_prod(xd + ic, cof1, zd + ic, ns); /* x[ic+i] = cof1[i]z[ic+i] */
    }
  }
  N_VConst(ZERO, z);

  /* Looping point for iterations. */

  for (iter = 1; iter <= ITMAX; iter++)
  {
    /* Calculate (D-inverse)*U*x if not the first iteration. */

    if (iter > 1)
    {
      for (jy = 0; jy < my; jy++)
      {
        iyoff = mxns * jy;
        for (jx = 0; jx < mx; jx++)
        { /* order of loops matters */
          ic    = iyoff + ns * jx;
          x_loc = (jx == 0) ? 0 : ((jx == mx - 1) ? 2 : 1);
          y_loc = (jy == 0) ? 0 : ((jy == my - 1) ? 2 : 1);
          switch (3 * y_loc + x_loc)
          {
          case 0: /* jx == 0, jy == 0 */
            /* x[ic+i] = beta2[i]x[ic+ns+i] + gam2[i]x[ic+mxns+i] */
            v_sum_prods(xd + ic, beta2, xd + ic + ns, gam2, xd + ic + mxns, ns);
            break;
          case 1: /* 1 <= jx <= mx-2, jy == 0 */
            /* x[ic+i] = beta[i]x[ic+ns+i] + gam2[i]x[ic+mxns+i] */
            v_sum_prods(xd + ic, beta, xd + ic + ns, gam2, xd + ic + mxns, ns);
            break;
          case 2: /* jx == mx-1, jy == 0 */
            /* x[ic+i] = gam2[i]x[ic+mxns+i] */
            v_prod(xd + ic, gam2, xd + ic + mxns, ns);
            break;
          case 3: /* jx == 0, 1 <= jy <= my-2 */
            /* x[ic+i] = beta2[i]x[ic+ns+i] + gam[i]x[ic+mxns+i] */
            v_sum_prods(xd + ic, beta2, xd + ic + ns, gam, xd + ic + mxns, ns);
            break;
          case 4: /* 1 <= jx <= mx-2, 1 <= jy <= my-2 */
            /* x[ic+i] = beta[i]x[ic+ns+i] + gam[i]x[ic+mxns+i] */
            v_sum_prods(xd + ic, beta, xd + ic + ns, gam, xd + ic + mxns, ns);
            break;
          case 5: /* jx == mx-1, 1 <= jy <= my-2 */
            /* x[ic+i] = gam[i]x[ic+mxns+i] */
            v_prod(xd + ic, gam, xd + ic + mxns, ns);
            break;
          case 6: /* jx == 0, jy == my-1 */
            /* x[ic+i] = beta2[i]x[ic+ns+i] */
            v_prod(xd + ic, beta2, xd + ic + ns, ns);
            break;
          case 7: /* 1 <= jx <= mx-2, jy == my-1 */
            /* x[ic+i] = beta[i]x[ic+ns+i] */
            v_prod(xd + ic, beta, xd + ic + ns, ns);
            break;
          case 8: /* jx == mx-1, jy == my-1 */
            /* x[ic+i] = ZERO */
            v_zero(xd + ic, ns);
            break;
          }
        }
      }
    } /* end if (iter > 1) */

    /* Overwrite x with [(I - (D-inverse)*L)-inverse]*x. */

    for (jy = 0; jy < my; jy++)
    {
      iyoff = mxns * jy;
      for (jx = 0; jx < mx; jx++)
      { /* order of loops matters */
        ic    = iyoff + ns * jx;
        x_loc = (jx == 0) ? 0 : ((jx == mx - 1) ? 2 : 1);
        y_loc = (jy == 0) ? 0 : ((jy == my - 1) ? 2 : 1);
        switch (3 * y_loc + x_loc)
        {
        case 0: /* jx == 0, jy == 0 */ break;
        case 1: /* 1 <= jx <= mx-2, jy == 0 */
          /* x[ic+i] += beta[i]x[ic-ns+i] */
          v_inc_by_prod(xd + ic, beta, xd + ic - ns, ns);
          break;
        case 2: /* jx == mx-1, jy == 0 */
          /* x[ic+i] += beta2[i]x[ic-ns+i] */
          v_inc_by_prod(xd + ic, beta2, xd + ic - ns, ns);
          break;
        case 3: /* jx == 0, 1 <= jy <= my-2 */
          /* x[ic+i] += gam[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, gam, xd + ic - mxns, ns);
          break;
        case 4: /* 1 <= jx <= mx-2, 1 <= jy <= my-2 */
          /* x[ic+i] += beta[i]x[ic-ns+i] + gam[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, beta, xd + ic - ns, ns);
          v_inc_by_prod(xd + ic, gam, xd + ic - mxns, ns);
          break;
        case 5: /* jx == mx-1, 1 <= jy <= my-2 */
          /* x[ic+i] += beta2[i]x[ic-ns+i] + gam[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, beta2, xd + ic - ns, ns);
          v_inc_by_prod(xd + ic, gam, xd + ic - mxns, ns);
          break;
        case 6: /* jx == 0, jy == my-1 */
          /* x[ic+i] += gam2[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, gam2, xd + ic - mxns, ns);
          break;
        case 7: /* 1 <= jx <= mx-2, jy == my-1 */
          /* x[ic+i] += beta[i]x[ic-ns+i] + gam2[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, beta, xd + ic - ns, ns);
          v_inc_by_prod(xd + ic, gam2, xd + ic - mxns, ns);
          break;
        case 8: /* jx == mx-1, jy == my-1 */
          /* x[ic+i] += beta2[i]x[ic-ns+i] + gam2[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, beta2, xd + ic - ns, ns);
          v_inc_by_prod(xd + ic, gam2, xd + ic - mxns, ns);
          break;
        }
      }
    }

    /* Add increment x to z : z <- z+x */

    N_VLinearSum(ONE, z, ONE, x, z);
  }
}